

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  vfloat<4> vVar2;
  BVH *bvh;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  undefined4 uVar9;
  long lVar10;
  ulong uVar11;
  NodeRef root;
  size_t sVar12;
  byte bVar13;
  size_t sVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  NodeRef *pNVar19;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar20;
  uint uVar21;
  bool bVar22;
  byte bVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  int iVar47;
  int iVar48;
  vint4 ai_2;
  undefined1 auVar49 [64];
  vint4 bi;
  undefined1 in_ZMM2 [64];
  vint4 bi_1;
  vint4 bi_3;
  vint4 ai;
  vint4 bi_2;
  vint4 ai_1;
  vint4 ai_3;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar54 [64];
  Precalculations pre;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar25 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar29 = ZEXT816(0) << 0x40;
    uVar6 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29,5);
    uVar24 = vpcmpeqd_avx512vl(auVar25,(undefined1  [16])valid_i->field_0);
    uVar24 = ((byte)uVar6 & 0xf) & uVar24;
    bVar23 = (byte)uVar24;
    if (bVar23 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar50 = ZEXT1664(auVar25);
      auVar26 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar25);
      auVar28._8_4_ = 0x219392ef;
      auVar28._0_8_ = 0x219392ef219392ef;
      auVar28._12_4_ = 0x219392ef;
      uVar11 = vcmpps_avx512vl(auVar26,auVar28,1);
      bVar22 = (bool)((byte)uVar11 & 1);
      auVar26._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._0_4_;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._4_4_;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._8_4_;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._12_4_;
      auVar27 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar25);
      uVar11 = vcmpps_avx512vl(auVar27,auVar28,1);
      bVar22 = (bool)((byte)uVar11 & 1);
      auVar27._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._16_4_;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._20_4_;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._24_4_;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._28_4_;
      auVar25 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar25);
      uVar11 = vcmpps_avx512vl(auVar25,auVar28,1);
      bVar22 = (bool)((byte)uVar11 & 1);
      auVar45._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._32_4_;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._36_4_;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._40_4_;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar45._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._44_4_;
      auVar28 = vrcp14ps_avx512vl(auVar26);
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_fma(auVar26,auVar28,auVar30);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar28,auVar28)
      ;
      auVar26 = vrcp14ps_avx512vl(auVar27);
      auVar25 = vfnmadd213ps_fma(auVar27,auVar26,auVar30);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar26,auVar26)
      ;
      auVar26 = vrcp14ps_avx512vl(auVar45);
      auVar25 = vfnmadd213ps_fma(auVar45,auVar26,auVar30);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar26,auVar26)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar11 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar29,1);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar25._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar11 & 1) * auVar25._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar25._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar25._12_4_;
      uVar11 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar29,5);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar22 = (bool)((byte)uVar11 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar22 * auVar25._0_4_ | (uint)!bVar22 * 0x60;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar22 * auVar25._4_4_ | (uint)!bVar22 * 0x60;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar22 * auVar25._8_4_ | (uint)!bVar22 * 0x60;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar22 * auVar25._12_4_ | (uint)!bVar22 * 0x60;
      uVar11 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar29,5);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar22 = (bool)((byte)uVar11 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar22 * auVar25._0_4_ | (uint)!bVar22 * 0xa0;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar22 * auVar25._4_4_ | (uint)!bVar22 * 0xa0;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar22 * auVar25._8_4_ | (uint)!bVar22 * 0xa0;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar22 * auVar25._12_4_ | (uint)!bVar22 * 0xa0;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar52 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar25 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar23 & 1) * auVar25._0_4_ |
           (uint)!(bool)(bVar23 & 1) * stack_near[0].field_0._0_4_;
      bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar22 * auVar25._4_4_ | (uint)!bVar22 * stack_near[0].field_0._4_4_;
      bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar22 * auVar25._8_4_ | (uint)!bVar22 * stack_near[0].field_0._8_4_;
      bVar22 = SUB81(uVar24 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar22 * auVar25._12_4_ | (uint)!bVar22 * stack_near[0].field_0._12_4_;
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar51 = ZEXT1664(auVar25);
      auVar29 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      tray.tfar.field_0.i[0] =
           (uint)(bVar23 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar25._0_4_;
      bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar22 * auVar29._4_4_ | (uint)!bVar22 * auVar25._4_4_;
      bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar22 * auVar29._8_4_ | (uint)!bVar22 * auVar25._8_4_;
      bVar22 = SUB81(uVar24 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar22 * auVar29._12_4_ | (uint)!bVar22 * auVar25._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar21 = 3;
      }
      else {
        uVar21 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      bVar15 = (byte)((ushort)((short)uVar24 << 0xc) >> 0xc) ^ 0xf;
      pNVar19 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar20 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar53 = ZEXT1664(auVar25);
      auVar25 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
      auVar54 = ZEXT1664(auVar25);
LAB_00765fc5:
      do {
        auVar25 = auVar51._0_16_;
        do {
          root.ptr = pNVar19[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00766543;
          pNVar19 = pNVar19 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar20[-1].v;
          auVar49 = ZEXT1664((undefined1  [16])vVar2.field_0);
          paVar20 = paVar20 + -1;
          uVar24 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar24 == '\0');
        uVar9 = (undefined4)uVar24;
        if (uVar21 < (uint)POPCOUNT(uVar9)) {
LAB_0076600c:
          do {
            iVar46 = 4;
            auVar25 = auVar51._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00766543;
              uVar6 = vcmpps_avx512vl((undefined1  [16])tray.tfar.field_0,auVar49._0_16_,6);
              if ((char)uVar6 == '\0') goto LAB_00765fc5;
              uVar24 = (ulong)((uint)root.ptr & 0xf);
              bVar8 = bVar15 & 0xf;
              if (uVar24 == 8) goto LAB_0076642f;
              bVar8 = bVar8 ^ 0xf;
              auVar29 = *(undefined1 (*) [16])(ray + 0x50);
              auVar26 = *(undefined1 (*) [16])(ray + 0x60);
              auVar27 = *(undefined1 (*) [16])(ray + 0x40);
              lVar10 = (root.ptr & 0xfffffffffffffff0) + 0x90;
              uVar11 = 0;
              goto LAB_0076620e;
            }
            lVar10 = 0;
            sVar14 = 8;
            auVar25 = auVar52._0_16_;
            do {
              sVar12 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar10 * 8);
              if (sVar12 == 8) {
                auVar49 = ZEXT1664(auVar25);
                sVar12 = sVar14;
                break;
              }
              uVar9 = *(undefined4 *)(root.ptr + 0x40 + lVar10 * 4);
              auVar41._4_4_ = uVar9;
              auVar41._0_4_ = uVar9;
              auVar41._8_4_ = uVar9;
              auVar41._12_4_ = uVar9;
              auVar27 = vfmsub132ps_fma(auVar41,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.x.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              auVar37._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar37._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar37._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar37._12_4_ = tray.org_rdir.field_0._28_4_;
              uVar9 = *(undefined4 *)(root.ptr + 0x80 + lVar10 * 4);
              auVar42._4_4_ = uVar9;
              auVar42._0_4_ = uVar9;
              auVar42._8_4_ = uVar9;
              auVar42._12_4_ = uVar9;
              auVar40._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar40._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar40._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar40._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar9 = *(undefined4 *)(root.ptr + 0xc0 + lVar10 * 4);
              auVar43._4_4_ = uVar9;
              auVar43._0_4_ = uVar9;
              auVar43._8_4_ = uVar9;
              auVar43._12_4_ = uVar9;
              auVar45 = vfmsub132ps_fma(auVar42,auVar37,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar28 = vfmsub132ps_fma(auVar43,auVar40,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar9 = *(undefined4 *)(root.ptr + 0x60 + lVar10 * 4);
              auVar29._4_4_ = uVar9;
              auVar29._0_4_ = uVar9;
              auVar29._8_4_ = uVar9;
              auVar29._12_4_ = uVar9;
              auVar30 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0,auVar29
                                  );
              uVar9 = *(undefined4 *)(root.ptr + 0xa0 + lVar10 * 4);
              auVar34._4_4_ = uVar9;
              auVar34._0_4_ = uVar9;
              auVar34._8_4_ = uVar9;
              auVar34._12_4_ = uVar9;
              auVar31 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar37,
                                   auVar34);
              uVar9 = *(undefined4 *)(root.ptr + 0xe0 + lVar10 * 4);
              auVar35._4_4_ = uVar9;
              auVar35._0_4_ = uVar9;
              auVar35._8_4_ = uVar9;
              auVar35._12_4_ = uVar9;
              auVar32 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar40,
                                   auVar35);
              auVar29 = vpminsd_avx(auVar27,auVar30);
              auVar26 = vpminsd_avx(auVar45,auVar31);
              auVar29 = vpmaxsd_avx(auVar29,auVar26);
              auVar26 = vpminsd_avx(auVar28,auVar32);
              auVar29 = vpmaxsd_avx(auVar29,auVar26);
              auVar26 = vpmaxsd_avx(auVar27,auVar30);
              auVar27 = vpmaxsd_avx(auVar45,auVar31);
              auVar27 = vpminsd_avx(auVar26,auVar27);
              auVar26 = vpmaxsd_avx(auVar28,auVar32);
              auVar27 = vpminsd_avx(auVar27,auVar26);
              auVar26 = vpmaxsd_avx(auVar29,(undefined1  [16])tray.tnear.field_0);
              auVar27 = vpminsd_avx(auVar27,(undefined1  [16])tray.tfar.field_0);
              uVar24 = vpcmpd_avx512vl(auVar26,auVar27,2);
              uVar24 = uVar24 & 0xf;
              if ((byte)uVar24 == 0) {
                auVar49 = ZEXT1664(auVar25);
                sVar12 = sVar14;
              }
              else {
                auVar26 = vblendmps_avx512vl(auVar52._0_16_,auVar29);
                bVar22 = (bool)((byte)uVar24 & 1);
                bVar3 = (bool)((byte)(uVar24 >> 1) & 1);
                bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
                bVar5 = SUB81(uVar24 >> 3,0);
                auVar49 = ZEXT1664(CONCAT412((uint)bVar5 * auVar26._12_4_ |
                                             (uint)!bVar5 * auVar29._12_4_,
                                             CONCAT48((uint)bVar4 * auVar26._8_4_ |
                                                      (uint)!bVar4 * auVar29._8_4_,
                                                      CONCAT44((uint)bVar3 * auVar26._4_4_ |
                                                               (uint)!bVar3 * auVar29._4_4_,
                                                               (uint)bVar22 * auVar26._0_4_ |
                                                               (uint)!bVar22 * auVar29._0_4_))));
                if (sVar14 != 8) {
                  pNVar19->ptr = sVar14;
                  pNVar19 = pNVar19 + 1;
                  *(undefined1 (*) [16])paVar20->v = auVar25;
                  paVar20 = paVar20 + 1;
                }
              }
              lVar10 = lVar10 + 1;
              auVar25 = auVar49._0_16_;
              sVar14 = sVar12;
            } while (lVar10 != 8);
            if (sVar12 == 8) goto LAB_0076617b;
            uVar6 = vcmpps_avx512vl((undefined1  [16])auVar49._0_16_,
                                    (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar12;
          } while ((byte)uVar21 < (byte)POPCOUNT((int)uVar6));
          pNVar19->ptr = sVar12;
          pNVar19 = pNVar19 + 1;
          *paVar20 = auVar49._0_16_;
          paVar20 = paVar20 + 1;
        }
        else {
          do {
            sVar14 = 0;
            for (uVar11 = uVar24; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              sVar14 = sVar14 + 1;
            }
            bVar22 = occluded1(This,bvh,root,sVar14,&pre,ray,&tray,context);
            bVar8 = (byte)(1 << ((uint)sVar14 & 0x1f));
            if (!bVar22) {
              bVar8 = 0;
            }
            bVar15 = bVar15 | bVar8;
            uVar24 = uVar24 - 1 & uVar24;
          } while (uVar24 != 0);
          iVar46 = 3;
          if (bVar15 != 0xf) {
            auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar22 = (bool)(bVar15 >> 1 & 1);
            bVar3 = (bool)(bVar15 >> 2 & 1);
            bVar4 = (bool)(bVar15 >> 3 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar22 * auVar25._4_4_ | (uint)!bVar22 * tray.tfar.field_0.i[1];
            tray.tfar.field_0.i[0] =
                 (uint)(bVar15 & 1) * auVar25._0_4_ |
                 (uint)!(bool)(bVar15 & 1) * tray.tfar.field_0.i[0];
            tray.tfar.field_0.i[2] =
                 (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
            tray.tfar.field_0.i[3] =
                 (uint)bVar4 * auVar25._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
            iVar46 = 2;
          }
          auVar25 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar50 = ZEXT1664(auVar25);
          auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar51 = ZEXT1664(auVar25);
          auVar25 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar52 = ZEXT1664(auVar25);
          auVar25 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar53 = ZEXT1664(auVar25);
          auVar25 = vxorps_avx512vl(auVar54._0_16_,auVar54._0_16_);
          auVar54 = ZEXT1664(auVar25);
          auVar49 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar21 < (uint)POPCOUNT(uVar9)) goto LAB_0076600c;
        }
LAB_0076617b:
        auVar25 = auVar51._0_16_;
      } while (iVar46 != 3);
LAB_00766543:
      bVar15 = bVar15 & bVar23;
      bVar22 = (bool)(bVar15 >> 1 & 1);
      bVar3 = (bool)(bVar15 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar15 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar15 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar22 * auVar25._4_4_ | (uint)!bVar22 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar15 >> 3) * auVar25._12_4_ | (uint)!(bool)(bVar15 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0xb0;
    if (uVar24 - 8 <= uVar11) break;
LAB_0076620e:
    uVar16 = 0;
    bVar13 = bVar8;
    while (uVar17 = (ulong)*(uint *)(lVar10 + uVar16 * 4), uVar17 != 0xffffffff) {
      uVar9 = *(undefined4 *)(lVar10 + -0x90 + uVar16 * 4);
      auVar31._4_4_ = uVar9;
      auVar31._0_4_ = uVar9;
      auVar31._8_4_ = uVar9;
      auVar31._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(lVar10 + -0x80 + uVar16 * 4);
      auVar32._4_4_ = uVar9;
      auVar32._0_4_ = uVar9;
      auVar32._8_4_ = uVar9;
      auVar32._12_4_ = uVar9;
      auVar45 = vsubps_avx(auVar31,*(undefined1 (*) [16])ray);
      auVar28 = vsubps_avx(auVar32,*(undefined1 (*) [16])(ray + 0x10));
      uVar9 = *(undefined4 *)(lVar10 + -0x70 + uVar16 * 4);
      auVar36._4_4_ = uVar9;
      auVar36._0_4_ = uVar9;
      auVar36._8_4_ = uVar9;
      auVar36._12_4_ = uVar9;
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0x60 + uVar16 * 4)));
      auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0x50 + uVar16 * 4)));
      auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0x40 + uVar16 * 4)));
      auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0x30 + uVar16 * 4)));
      auVar30 = vsubps_avx(auVar36,*(undefined1 (*) [16])(ray + 0x20));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0x20 + uVar16 * 4)));
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0x10 + uVar16 * 4)));
      auVar31 = vmulss_avx512f(auVar33,auVar37);
      auVar38._0_4_ = auVar31._0_4_;
      auVar38._4_4_ = auVar38._0_4_;
      auVar38._8_4_ = auVar38._0_4_;
      auVar38._12_4_ = auVar38._0_4_;
      auVar38 = vfmsub231ps_avx512vl(auVar38,auVar36,auVar34);
      auVar31 = vmulss_avx512f(auVar34,auVar35);
      auVar39._0_4_ = auVar31._0_4_;
      auVar39._4_4_ = auVar39._0_4_;
      auVar39._8_4_ = auVar39._0_4_;
      auVar39._12_4_ = auVar39._0_4_;
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar37,auVar32);
      auVar31 = vmulss_avx512f(auVar32,auVar36);
      auVar31 = vbroadcastss_avx512vl(auVar31);
      auVar40 = vfmsub231ps_avx512vl(auVar31,auVar35,auVar33);
      auVar31 = vmulps_avx512vl(auVar29,auVar30);
      auVar41 = vfmsub231ps_avx512vl(auVar31,auVar28,auVar26);
      auVar31 = vmulps_avx512vl(auVar26,auVar45);
      auVar42 = vfmsub231ps_avx512vl(auVar31,auVar30,auVar27);
      auVar31 = vmulps_avx512vl(auVar27,auVar28);
      auVar43 = vfmsub231ps_avx512vl(auVar31,auVar45,auVar29);
      auVar31 = vmulps_avx512vl(auVar40,auVar26);
      auVar31 = vfmadd231ps_fma(auVar31,auVar39,auVar29);
      auVar31 = vfmadd231ps_fma(auVar31,auVar38,auVar27);
      auVar44 = vandps_avx512vl(auVar31,auVar53._0_16_);
      auVar37 = vmulps_avx512vl(auVar37,auVar43);
      auVar36 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar36);
      auVar35 = vfmadd231ps_avx512vl(auVar36,auVar41,auVar35);
      auVar35 = vxorps_avx512vl(auVar44,auVar35);
      auVar36 = auVar54._0_16_;
      uVar6 = vcmpps_avx512vl(auVar35,auVar36,5);
      bVar18 = (byte)uVar6 & bVar13;
      if (bVar18 == 0) {
LAB_00766310:
        bVar18 = 0;
      }
      else {
        auVar34 = vmulps_avx512vl(auVar34,auVar43);
        auVar33 = vfmadd213ps_avx512vl(auVar42,auVar33,auVar34);
        auVar32 = vfmadd213ps_avx512vl(auVar41,auVar32,auVar33);
        auVar32 = vxorps_avx512vl(auVar44,auVar32);
        uVar6 = vcmpps_avx512vl(auVar32,auVar36,5);
        bVar18 = bVar18 & (byte)uVar6;
        if (bVar18 == 0) goto LAB_00766310;
        auVar33 = vandps_avx512vl(auVar31,auVar50._0_16_);
        auVar34 = vsubps_avx512vl(auVar33,auVar35);
        uVar6 = vcmpps_avx512vl(auVar34,auVar32,5);
        bVar18 = bVar18 & (byte)uVar6;
        if (bVar18 == 0) goto LAB_00766310;
        auVar30 = vmulps_avx512vl(auVar40,auVar30);
        auVar28 = vfmadd213ps_fma(auVar28,auVar39,auVar30);
        auVar45 = vfmadd213ps_fma(auVar45,auVar38,auVar28);
        auVar45 = vxorps_avx512vl(auVar44,auVar45);
        auVar28 = vmulps_avx512vl(auVar33,*(undefined1 (*) [16])(ray + 0x30));
        auVar30 = vmulps_avx512vl(auVar33,*(undefined1 (*) [16])(ray + 0x80));
        uVar6 = vcmpps_avx512vl(auVar45,auVar30,2);
        uVar7 = vcmpps_avx512vl(auVar28,auVar45,1);
        bVar18 = bVar18 & (byte)uVar6 & (byte)uVar7;
        if (bVar18 == 0) {
          bVar18 = 0;
          auVar45 = vxorps_avx512vl(auVar36,auVar36);
          auVar54 = ZEXT1664(auVar45);
        }
        else {
          auVar45 = vxorps_avx512vl(auVar36,auVar36);
          auVar54 = ZEXT1664(auVar45);
          uVar6 = vcmpps_avx512vl(auVar31,auVar45,4);
          bVar18 = bVar18 & (byte)uVar6;
        }
      }
      uVar1 = ((context->scene->geometries).items[uVar17].ptr)->mask;
      auVar33._4_4_ = uVar1;
      auVar33._0_4_ = uVar1;
      auVar33._8_4_ = uVar1;
      auVar33._12_4_ = uVar1;
      uVar6 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar33);
      bVar18 = (byte)uVar6 & 0xf & bVar18;
      bVar13 = bVar13 & (-(bVar18 == 0) | bVar18 ^ 0xf);
      if ((bVar13 == 0) || (bVar22 = 2 < uVar16, uVar16 = uVar16 + 1, bVar22)) break;
    }
    bVar8 = bVar8 & bVar13;
    if (bVar8 == 0) break;
  }
  bVar8 = bVar8 ^ 0xf;
LAB_0076642f:
  bVar15 = bVar15 | bVar8;
  if (bVar15 == 0xf) {
    bVar15 = 0xf;
    goto LAB_00766543;
  }
  auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  iVar46 = tray.tfar.field_0._0_4_;
  bVar22 = (bool)(bVar15 >> 1 & 1);
  bVar3 = (bool)(bVar15 >> 2 & 1);
  iVar47 = tray.tfar.field_0._8_4_;
  bVar4 = (bool)(bVar15 >> 3 & 1);
  iVar48 = tray.tfar.field_0._12_4_;
  tray.tfar.field_0.i[1] = (uint)bVar22 * auVar25._4_4_ | (uint)!bVar22 * tray.tfar.field_0._4_4_;
  tray.tfar.field_0.i[0] = (uint)(bVar15 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar15 & 1) * iVar46;
  tray.tfar.field_0.i[2] = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * iVar47;
  tray.tfar.field_0.i[3] = (uint)bVar4 * auVar25._12_4_ | (uint)!bVar4 * iVar48;
  goto LAB_00765fc5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }